

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O0

void __thiscall
draco::OctahedronToolBox::InvertDiamond(OctahedronToolBox *this,int32_t *s,int32_t *t)

{
  uint uVar1;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  uint32_t temp;
  uint32_t ut;
  uint32_t us;
  uint32_t corner_point_t;
  uint32_t corner_point_s;
  int32_t sign_t;
  int32_t sign_s;
  uint local_30;
  uint local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int *local_18;
  int *local_10;
  
  if ((*in_RSI < 0) || (*in_RDX < 0)) {
    if ((*in_RSI < 1) && (*in_RDX < 1)) {
      local_1c = -1;
      local_20 = -1;
    }
    else {
      local_1c = -1;
      if (0 < *in_RSI) {
        local_1c = 1;
      }
      local_20 = -1;
      if (0 < *in_RDX) {
        local_20 = 1;
      }
    }
  }
  else {
    local_1c = 1;
    local_20 = 1;
  }
  local_24 = local_1c * *(int *)(in_RDI + 0x10);
  local_28 = local_20 * *(int *)(in_RDI + 0x10);
  local_2c = *in_RSI * 2 - local_24;
  local_30 = *in_RDX * 2 - local_28;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (local_1c * local_20 < 0) {
    std::swap<unsigned_int>(&local_2c,&local_30);
  }
  else {
    uVar1 = -local_30;
    local_30 = -local_2c;
    local_2c = uVar1;
  }
  *local_10 = local_2c + local_24;
  *local_18 = local_30 + local_28;
  *local_10 = *local_10 / 2;
  *local_18 = *local_18 / 2;
  return;
}

Assistant:

void InvertDiamond(int32_t *s, int32_t *t) const {
    // Expect center already at origin.
    DRACO_DCHECK_LE(*s, center_value_);
    DRACO_DCHECK_LE(*t, center_value_);
    DRACO_DCHECK_GE(*s, -center_value_);
    DRACO_DCHECK_GE(*t, -center_value_);
    int32_t sign_s = 0;
    int32_t sign_t = 0;
    if (*s >= 0 && *t >= 0) {
      sign_s = 1;
      sign_t = 1;
    } else if (*s <= 0 && *t <= 0) {
      sign_s = -1;
      sign_t = -1;
    } else {
      sign_s = (*s > 0) ? 1 : -1;
      sign_t = (*t > 0) ? 1 : -1;
    }

    // Perform the addition and subtraction using unsigned integers to avoid
    // signed integer overflows for bad data. Note that the result will be
    // unchanged for non-overflowing cases.
    const uint32_t corner_point_s = sign_s * center_value_;
    const uint32_t corner_point_t = sign_t * center_value_;
    uint32_t us = *s;
    uint32_t ut = *t;
    us = us + us - corner_point_s;
    ut = ut + ut - corner_point_t;
    if (sign_s * sign_t >= 0) {
      uint32_t temp = us;
      us = -ut;
      ut = -temp;
    } else {
      std::swap(us, ut);
    }
    us = us + corner_point_s;
    ut = ut + corner_point_t;

    *s = us;
    *t = ut;
    *s /= 2;
    *t /= 2;
  }